

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRuntimeFail.cpp
# Opt level: O1

void __thiscall Test_testDepthOverflow::Run(Test_testDepthOverflow *this)

{
  nullres nVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char buf [512];
  char local_218;
  char cStack_217;
  char cStack_216;
  char cStack_215;
  char cStack_214;
  char cStack_213;
  char cStack_212;
  char cStack_211;
  char cStack_210;
  char cStack_20f;
  char cStack_20e;
  char cStack_20d;
  char cStack_20c;
  char cStack_20b;
  char cStack_20a;
  char cStack_209;
  char cStack_208;
  char cStack_207;
  char cStack_206;
  char cStack_205;
  char cStack_204;
  char cStack_203;
  undefined1 local_19;
  
  nullcClean();
  nullcSetExecutorStackSize(0x4000);
  if (Tests::messageVerbose == '\x01') {
    puts("Call depth test\r");
  }
  if (DAT_003f9493 == '\x01') {
    testsCount[1] = testsCount[1] + 1;
    nullcSetExecutor(1);
    nVar1 = nullcBuild(testDepthOverflow);
    if (nVar1 == '\0') {
      __assert_fail("good",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/TestRuntimeFail.cpp"
                    ,0x1db,"virtual void Test_testDepthOverflow::Run()");
    }
    nVar1 = nullcRun();
    if (nVar1 == '\0') {
      pcVar2 = nullcGetLastError();
      pcVar2 = strstr(pcVar2,"ERROR:");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = nullcGetLastError();
      }
      strncpy(&local_218,pcVar2,0x1ff);
      local_19 = 0;
      pcVar2 = strchr(&local_218,0xd);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      auVar4[0] = -(cStack_212 == ' ');
      auVar4[1] = -(cStack_211 == 's');
      auVar4[2] = -(cStack_210 == 't');
      auVar4[3] = -(cStack_20f == 'a');
      auVar4[4] = -(cStack_20e == 'c');
      auVar4[5] = -(cStack_20d == 'k');
      auVar4[6] = -(cStack_20c == ' ');
      auVar4[7] = -(cStack_20b == 'o');
      auVar4[8] = -(cStack_20a == 'v');
      auVar4[9] = -(cStack_209 == 'e');
      auVar4[10] = -(cStack_208 == 'r');
      auVar4[0xb] = -(cStack_207 == 'f');
      auVar4[0xc] = -(cStack_206 == 'l');
      auVar4[0xd] = -(cStack_205 == 'o');
      auVar4[0xe] = -(cStack_204 == 'w');
      auVar4[0xf] = -(cStack_203 == '\0');
      auVar3[0] = -(local_218 == 'E');
      auVar3[1] = -(cStack_217 == 'R');
      auVar3[2] = -(cStack_216 == 'R');
      auVar3[3] = -(cStack_215 == 'O');
      auVar3[4] = -(cStack_214 == 'R');
      auVar3[5] = -(cStack_213 == ':');
      auVar3[6] = -(cStack_212 == ' ');
      auVar3[7] = -(cStack_211 == 's');
      auVar3[8] = -(cStack_210 == 't');
      auVar3[9] = -(cStack_20f == 'a');
      auVar3[10] = -(cStack_20e == 'c');
      auVar3[0xb] = -(cStack_20d == 'k');
      auVar3[0xc] = -(cStack_20c == ' ');
      auVar3[0xd] = -(cStack_20b == 'o');
      auVar3[0xe] = -(cStack_20a == 'v');
      auVar3[0xf] = -(cStack_209 == 'e');
      auVar3 = auVar3 & auVar4;
      if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff) {
        testsPassed[1] = testsPassed[1] + 1;
      }
      else {
        if (Tests::messageVerbose == '\0') {
          puts("Call depth test\r");
        }
        printf("X86 failed but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n",&local_218,
               "ERROR: stack overflow");
      }
    }
    else {
      if (Tests::messageVerbose == '\0') {
        puts("Call depth test\r");
      }
      puts("Test should have failed.\r");
    }
  }
  nullcClean();
  nullcSetExecutorStackSize(Tests::testStackSize);
  return;
}

Assistant:

virtual void Run()
	{
		nullcClean();
		nullcSetExecutorStackSize(16 * 1024);

		if(Tests::messageVerbose)
			printf("Call depth test\r\n");

		if(Tests::testHardFailureExecutor[TEST_TYPE_X86])
		{
			testsCount[TEST_TYPE_X86]++;
			nullcSetExecutor(NULLC_X86);
			nullres good = nullcBuild(testDepthOverflow);
			assert(good);
			good = nullcRun();
			if(!good)
			{
				const char *expected = "ERROR: stack overflow";
				char buf[512];

				if(const char *pos = strstr(nullcGetLastError(), "ERROR:"))
					strncpy(buf, pos, 511);
				else
					strncpy(buf, nullcGetLastError(), 511);

				buf[511] = 0;

				if(char *lineEnd = strchr(buf, '\r'))
					*lineEnd = 0;
				if(strcmp(expected, buf) != 0)
				{
					if(!Tests::messageVerbose)
						printf("Call depth test\r\n");
					printf("X86 failed but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n", buf, expected);
				}else{
					testsPassed[TEST_TYPE_X86]++;
				}
			}else{
				if(!Tests::messageVerbose)
					printf("Call depth test\r\n");
				printf("Test should have failed.\r\n");
			}
		}

		nullcClean();
		nullcSetExecutorStackSize(Tests::testStackSize);
	}